

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O0

Quaternion *
AML::integrateQuat(Quaternion *__return_storage_ptr__,Quaternion *quat,Quaternion *quatRates,
                  double dt)

{
  Quaternion *quatNew;
  Quaternion local_40;
  double local_20;
  double dt_local;
  Quaternion *quatRates_local;
  Quaternion *quat_local;
  
  local_20 = dt;
  dt_local = (double)quatRates;
  quatRates_local = quat;
  operator*(&local_40,quatRates,dt);
  operator+(__return_storage_ptr__,quat,&local_40);
  normalise(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Quaternion integrateQuat(const Quaternion& quat, const Quaternion& quatRates, double dt)
    {
        Quaternion quatNew = quat + quatRates * dt; // First Order Euler Integration
        normalise(quatNew);                         // Normalisation
        return quatNew;
    }